

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

NodeType __thiscall c4::yml::Tree::type(Tree *this,size_t node)

{
  NodeData *pNVar1;
  size_t in_stack_00000038;
  Tree *in_stack_00000040;
  
  pNVar1 = _p(in_stack_00000040,in_stack_00000038);
  return (NodeType)(pNVar1->m_type).type;
}

Assistant:

const char* type_str(size_t node) const { return NodeType::type_str(_p(node)->m_type); }